

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O2

void __thiscall hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,UnaryExpression *expr)

{
  undefined1 *puVar1;
  Expression *this_00;
  NotSupportedException *this_01;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view sVar3;
  format_args args;
  string_view fmt;
  string sStack_58;
  char *local_38;
  size_t local_30;
  
  this_00 = expr->operand_;
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"(");
  switch(expr->op) {
  case Plus:
    pcVar2 = "+";
    break;
  case Minus:
    pcVar2 = "-";
    break;
  case BitwiseNot:
    pcVar2 = "~";
    break;
  default:
    this_01 = (NotSupportedException *)__cxa_allocate_exception(0x20);
    sVar3 = slang::ast::toString(expr->op);
    local_38 = sVar3._M_str;
    local_30 = sVar3._M_len;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_38;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x25;
    ::fmt::v9::vformat_abi_cxx11_(&sStack_58,(v9 *)"Unary type {0} not supported for hgdb",fmt,args)
    ;
    NotSupportedException::NotSupportedException(this_01,&sStack_58,*this->loc_);
    __cxa_throw(this_01,&NotSupportedException::typeinfo,std::runtime_error::~runtime_error);
  case LogicalNot:
    pcVar2 = "!";
    break;
  case Preincrement:
    pcVar2 = "++";
    break;
  case Predecrement:
    pcVar2 = "--";
    break;
  case Postincrement:
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(this_00,this);
    pcVar2 = "++";
    goto LAB_00144203;
  case Postdecrement:
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(this_00,this);
    pcVar2 = "--";
LAB_00144203:
    std::operator<<((ostream *)puVar1,pcVar2);
    return;
  }
  std::operator<<((ostream *)puVar1,pcVar2);
  slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(this_00,this);
  return;
}

Assistant:

void handle(const slang::ast::UnaryExpression &expr) {
        auto const &op = expr.operand();
        ss_ << "(";
        // simple ones that have C++ operator overloaded
        switch (expr.op) {
            case slang::ast::UnaryOperator::Minus:
                ss_ << "-";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Plus:
                ss_ << "+";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Predecrement:
                ss_ << "--";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Preincrement:
                ss_ << "++";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::LogicalNot:
                ss_ << "!";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::BitwiseNot:
                ss_ << "~";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Postdecrement:
                op.visit(*this);
                ss_ << "--";
                break;
            case slang::ast::UnaryOperator::Postincrement:
                op.visit(*this);
                ss_ << "++";
                break;
            default:
                throw NotSupportedException(fmt::format("Unary type {0} not supported for hgdb",
                                                        slang::ast::toString(expr.op)),
                                            loc_);
        }
    }